

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4f>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,matrix4f *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::matrix4f> local_14c;
  undefined1 local_108 [8];
  optional<tinyusdz::value::matrix4f> pv_1;
  undefined1 local_7c [8];
  optional<tinyusdz::value::matrix4f> pv;
  matrix4f *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (matrix4f *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_0017458b;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&pv.contained + 0x38),t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&pv.contained + 0x38));
  if (bVar1) {
    get_default_value<tinyusdz::value::matrix4f>
              ((optional<tinyusdz::value::matrix4f> *)((long)&pv_1.contained + 0x3c),this);
    nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::
    optional<tinyusdz::value::matrix4f,_0>
              ((optional<tinyusdz::value::matrix4f> *)local_7c,
               (optional<tinyusdz::value::matrix4f> *)((long)&pv_1.contained + 0x3c));
    nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::~optional
              ((optional<tinyusdz::value::matrix4f> *)((long)&pv_1.contained + 0x3c));
    pv_1.contained._56_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_7c);
    if ((bool)pv_1.contained._56_1_) {
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::value
                         ((optional<tinyusdz::value::matrix4f> *)local_7c);
      memcpy(v,pvVar2,0x40);
      this_local._7_1_ = 1;
    }
    pv_1.contained._57_3_ = 0;
    nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::~optional
              ((optional<tinyusdz::value::matrix4f> *)local_7c);
    if (pv_1.contained._56_4_ != 0) goto LAB_0017458b;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_0017458b;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::matrix4f,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<tinyusdz::value::matrix4f>(&local_14c,this);
      nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::
      optional<tinyusdz::value::matrix4f,_0>
                ((optional<tinyusdz::value::matrix4f> *)local_108,&local_14c);
      nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::~optional(&local_14c);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_108);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::value
                           ((optional<tinyusdz::value::matrix4f> *)local_108);
        memcpy(v,pvVar2,0x40);
        this_local._7_1_ = 1;
      }
      pv_1.contained._57_3_ = 0;
      pv_1.contained._56_1_ = bVar1;
      nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::~optional
                ((optional<tinyusdz::value::matrix4f> *)local_108);
      if (pv_1.contained._56_4_ != 0) goto LAB_0017458b;
    }
    this_local._7_1_ = 0;
  }
LAB_0017458b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }